

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool ra_range_uint32_array(roaring_array_t *ra,size_t offset,size_t limit,uint32_t *ans)

{
  size_t sVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  void *__s;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  run_container_t *run;
  bool bVar15;
  _Bool _Var16;
  void *local_90;
  long local_58;
  
  local_58 = 0;
  if (ra->size < 1) {
    _Var16 = true;
    local_90 = (void *)0x0;
  }
  else {
    bVar4 = false;
    lVar11 = 0;
    uVar10 = 0;
    uVar14 = 0;
    local_90 = (void *)0x0;
    lVar9 = 0;
    uVar12 = 0;
    do {
      run = (run_container_t *)ra->containers[lVar11];
      if (ra->typecodes[lVar11] == '\x04') {
        uVar2 = *(uint8_t *)&run->runs;
        ra->typecodes[lVar11] = uVar2;
        if (uVar2 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        run = *(run_container_t **)run;
      }
      uVar2 = ra->typecodes[lVar11];
      if (uVar2 == '\x03') {
        lVar9 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar9 + 4) & 0x20) == 0) {
          iVar6 = run->n_runs;
          lVar9 = (long)iVar6;
          if (0 < lVar9) {
            lVar7 = 0;
            do {
              iVar6 = iVar6 + (uint)run->runs[lVar7].length;
              lVar7 = lVar7 + 1;
            } while (lVar9 != lVar7);
          }
        }
        else {
          iVar6 = _avx2_run_container_cardinality(run);
        }
        lVar9 = (long)iVar6;
      }
      else if ((uVar2 == '\x02') || (uVar2 == '\x01')) {
        lVar9 = (long)run->n_runs;
      }
      uVar8 = uVar12;
      if (uVar10 < limit + offset && offset <= (lVar9 + uVar10) - 1) {
        if (bVar4) {
LAB_0011942a:
          uVar8 = lVar9 + uVar12;
          if (uVar14 < uVar8) {
            sVar1 = (uVar14 + lVar9) * 4;
            __s = malloc(sVar1);
            if (__s == (void *)0x0) {
              pvVar13 = local_90;
              if (local_90 != (void *)0x0) goto LAB_001194e4;
            }
            else {
              memset(__s,0,sVar1);
              memcpy(__s,local_90,uVar12 * 4);
              pvVar13 = __s;
              uVar14 = uVar14 + lVar9;
LAB_001194e4:
              free(local_90);
              local_90 = pvVar13;
            }
            if (__s == (void *)0x0) {
              cVar5 = '\x01';
              bVar15 = false;
              goto LAB_001195de;
            }
          }
          uVar2 = ra->typecodes[lVar11];
          if (uVar2 == '\x01') {
            bitset_container_to_uint32_array
                      ((uint32_t *)((long)local_90 + uVar12 * 4),(bitset_container_t *)run,
                       (uint)ra->keys[lVar11] << 0x10);
          }
          else if (uVar2 == '\x02') {
            if (0 < run->n_runs) {
              uVar3 = ra->keys[lVar11];
              lVar7 = 0;
              do {
                *(uint *)((long)local_90 + lVar7 * 4 + uVar12 * 4) =
                     CONCAT22(uVar3,(&run->runs->value)[lVar7]);
                lVar7 = lVar7 + 1;
              } while (lVar7 < run->n_runs);
            }
          }
          else if (uVar2 == '\x03') {
            run_container_to_uint32_array
                      ((void *)((long)local_90 + uVar12 * 4),run,(uint)ra->keys[lVar11] << 0x10);
          }
          goto LAB_001195c3;
        }
        local_58 = offset - uVar10;
        sVar1 = (local_58 + limit) * 4;
        local_90 = malloc(sVar1);
        if (local_90 != (void *)0x0) {
          memset(local_90,0,sVar1);
          bVar4 = true;
          uVar14 = local_58 + limit;
          goto LAB_0011942a;
        }
        cVar5 = '\x01';
        bVar4 = true;
        local_90 = (void *)0x0;
        bVar15 = false;
      }
      else {
LAB_001195c3:
        uVar10 = uVar10 + lVar9;
        bVar15 = uVar8 - local_58 < limit;
        cVar5 = !bVar15 * '\x02';
        uVar12 = uVar8;
      }
LAB_001195de:
      if (!bVar15) goto LAB_00119612;
      lVar11 = lVar11 + 1;
    } while (lVar11 < ra->size);
    cVar5 = '\x02';
LAB_00119612:
    _Var16 = cVar5 == '\x02';
  }
  if ((_Var16 != false) && (local_90 != (void *)0x0)) {
    memcpy(ans,(void *)((long)local_90 + local_58 * 4),limit << 2);
    free(local_90);
  }
  return _Var16;
}

Assistant:

bool ra_range_uint32_array(const roaring_array_t *ra, size_t offset, size_t limit, uint32_t *ans) {
    size_t ctr = 0;
    size_t dtr = 0;

    size_t t_limit = 0;

    bool first = false;
    size_t first_skip = 0;

    uint32_t *t_ans = NULL;
    size_t cur_len = 0;

    for (int i = 0; i < ra->size; ++i) {

        const container_t *c = container_unwrap_shared(
                                        ra->containers[i], &ra->typecodes[i]);
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                t_limit = (const_CAST_bitset(c))->cardinality;
                break;
            case ARRAY_CONTAINER_TYPE:
                t_limit = (const_CAST_array(c))->cardinality;
                break;
            case RUN_CONTAINER_TYPE:
                t_limit = run_container_cardinality(const_CAST_run(c));
                break;
        }
        if (ctr + t_limit - 1 >= offset && ctr < offset + limit){
            if (!first){
                //first_skip = t_limit - (ctr + t_limit - offset);
                first_skip = offset - ctr;
                first = true;
                t_ans = (uint32_t *)malloc(sizeof(*t_ans) * (first_skip + limit));
                if(t_ans == NULL) {
                  return false;
                }
                memset(t_ans, 0, sizeof(*t_ans) * (first_skip + limit)) ;
                cur_len = first_skip + limit;
            }
            if (dtr + t_limit > cur_len){
                uint32_t * append_ans = (uint32_t *)malloc(sizeof(*append_ans) * (cur_len + t_limit));
                if(append_ans == NULL) {
                  if(t_ans != NULL) free(t_ans);
                  return false;
                }
                memset(append_ans, 0, sizeof(*append_ans) * (cur_len + t_limit));
                cur_len = cur_len + t_limit;
                memcpy(append_ans, t_ans, dtr * sizeof(uint32_t));
                free(t_ans);
                t_ans = append_ans;
            }
            switch (ra->typecodes[i]) {
                case BITSET_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_bitset(c),  ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
                case ARRAY_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_array(c), ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
                case RUN_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_run(c), ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
            }
            dtr += t_limit;
        }
        ctr += t_limit;
        if (dtr-first_skip >= limit) break;
    }
    if(t_ans != NULL) {
      memcpy(ans, t_ans+first_skip, limit * sizeof(uint32_t));
      free(t_ans);
    }
    return true;
}